

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O0

bool __thiscall
Js::DeserializationCloner<Js::StreamReader>::TryCloneObject
          (DeserializationCloner<Js::StreamReader> *this,SrcTypeId typeId,Src src,Dst *dst,
          SCADeepCloneType *deepClone)

{
  code *pcVar1;
  bool bVar2;
  uint32 len_00;
  int iVar3;
  Engine *this_00;
  void *pvVar4;
  Var pvVar5;
  JavascriptString *pJVar6;
  JavascriptBooleanObject *pJVar7;
  JavascriptDate *pJVar8;
  JavascriptNumberObject *pJVar9;
  JavascriptStringObject *pJVar10;
  JavascriptRegExp *pJVar11;
  DynamicObject *pDVar12;
  JavascriptMap *pJVar13;
  JavascriptSet *pJVar14;
  JavascriptArray *pJVar15;
  undefined4 extraout_var;
  SharedArrayBuffer *pSVar16;
  undefined4 *puVar17;
  RecyclableObject *pRVar18;
  SharedArrayBuffer *arrayBuffer_1;
  SharedContents *sharedContents;
  ArrayBuffer *arrayBuffer;
  uint32 local_90;
  uint32 len_3;
  uint32 length;
  DWORD flags;
  char16 *buf_2;
  char16 *pcStack_78;
  charcount_t len_2;
  char16 *buf_1;
  double dStack_68;
  charcount_t len_1;
  double dbl_1;
  double dbl;
  char16 *buf;
  uint local_48;
  charcount_t len;
  scaposition_t pos;
  bool isObject;
  JavascriptLibrary *lib;
  ScriptContext *scriptContext;
  SCADeepCloneType *deepClone_local;
  Dst *dst_local;
  Src src_local;
  SrcTypeId typeId_local;
  DeserializationCloner<Js::StreamReader> *this_local;
  
  scriptContext = (ScriptContext *)deepClone;
  deepClone_local = (SCADeepCloneType *)dst;
  dst_local._0_4_ = src;
  dst_local._4_4_ = typeId;
  _src_local = this;
  lib = (JavascriptLibrary *)ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
  _pos = ScriptContext::GetLibrary((ScriptContext *)lib);
  *(undefined4 *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = 0;
  len._3_1_ = 1;
  if (dst_local._4_4_ == SCA_Transferable) {
    StreamReader::Read<unsigned_int>(this->m_reader,&local_48);
    this_00 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
              ::GetEngine(&this->
                           super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                         );
    pvVar4 = SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::
             ClaimTransferable(this_00,(ulong)local_48,_pos);
    *(void **)deepClone_local = pvVar4;
    if (*(undefined8 *)deepClone_local != None) {
      return true;
    }
    ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
  }
  if ((int)dst_local._4_4_ < 100) {
    switch(dst_local._4_4_) {
    case SCA_StringValue:
      dbl = (double)ReadString(this,(charcount_t *)((long)&buf + 4));
      pJVar6 = JavascriptString::NewWithBuffer((char16 *)dbl,buf._4_4_,(ScriptContext *)lib);
      *(JavascriptString **)deepClone_local = pJVar6;
      len._3_1_ = 0;
      break;
    case SCA_BooleanTrueObject:
      pJVar7 = JavascriptLibrary::CreateBooleanObject(_pos,1);
      *(JavascriptBooleanObject **)deepClone_local = pJVar7;
      break;
    case SCA_BooleanFalseObject:
      pJVar7 = JavascriptLibrary::CreateBooleanObject(_pos,0);
      *(JavascriptBooleanObject **)deepClone_local = pJVar7;
      break;
    case SCA_DateObject:
      StreamReader::Read<double>(this->m_reader,&dbl_1);
      pJVar8 = JavascriptLibrary::CreateDate(_pos,dbl_1);
      *(JavascriptDate **)deepClone_local = pJVar8;
      break;
    case SCA_NumberObject:
      StreamReader::Read<double>(this->m_reader,&stack0xffffffffffffff98);
      pJVar9 = JavascriptLibrary::CreateNumberObjectWithCheck(_pos,dStack_68);
      *(JavascriptNumberObject **)deepClone_local = pJVar9;
      break;
    case SCA_StringObject:
      pcStack_78 = ReadString(this,(charcount_t *)((long)&buf_1 + 4));
      pJVar10 = JavascriptLibrary::CreateStringObject(_pos,pcStack_78,buf_1._4_4_);
      *(JavascriptStringObject **)deepClone_local = pJVar10;
      break;
    case SCA_RegExpObject:
      _length = ReadString(this,(charcount_t *)((long)&buf_2 + 4));
      StreamReader::Read<unsigned_int>(this->m_reader,&len_3);
      pJVar11 = JavascriptRegExp::CreateRegEx
                          (_length,buf_2._4_4_,(RegexFlags)len_3,(ScriptContext *)lib);
      *(JavascriptRegExp **)deepClone_local = pJVar11;
      break;
    case SCA_Object:
      pDVar12 = JavascriptLibrary::CreateObject(_pos,false,0);
      *(DynamicObject **)deepClone_local = pDVar12;
      *(undefined4 *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = 1;
      break;
    case SCA_DenseArray:
    case SCA_SparseArray:
      Read(this,&local_90);
      pJVar15 = JavascriptLibrary::CreateArray(_pos,local_90);
      *(JavascriptArray **)deepClone_local = pJVar15;
      *(undefined4 *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = 1;
      break;
    case SCA_ArrayBuffer:
      StreamReader::Read<unsigned_int>(this->m_reader,(uint *)((long)&arrayBuffer + 4));
      sharedContents =
           (SharedContents *)JavascriptLibrary::CreateArrayBuffer(_pos,arrayBuffer._4_4_);
      iVar3 = (*(((ArrayBufferBase *)&sharedContents->buffer)->super_DynamicObject).
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])();
      len_00 = (**(code **)(sharedContents->buffer + 0x388))();
      Read(this,(BYTE *)CONCAT44(extraout_var,iVar3),len_00);
      *(SharedContents **)deepClone_local = sharedContents;
      break;
    case SCA_Uint8ClampedArray:
    default:
      if ((dst_local._4_4_ != SCA_Uint8ClampedArray) &&
         ((((int)dst_local._4_4_ < 0x3d || (0x44 < (int)dst_local._4_4_)) &&
          (dst_local._4_4_ != SCA_DataView)))) {
        return false;
      }
      ReadTypedArray(this,dst_local._4_4_,(Dst *)deepClone_local);
      break;
    case SCA_Map:
      pJVar13 = JavascriptMap::New((ScriptContext *)lib);
      *(JavascriptMap **)deepClone_local = pJVar13;
      *(undefined4 *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = 2;
      break;
    case SCA_Set:
      pJVar14 = JavascriptSet::New((ScriptContext *)lib);
      *(JavascriptSet **)deepClone_local = pJVar14;
      *(undefined4 *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = 3;
      break;
    case SCA_SharedArrayBuffer:
      StreamReader::Read<long>(this->m_reader,(long *)&arrayBuffer_1);
      pSVar16 = JavascriptLibrary::CreateSharedArrayBuffer(_pos,(SharedContents *)arrayBuffer_1);
      iVar3 = (*(pSVar16->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x6d])();
      bVar2 = SharedContents::IsWebAssembly((SharedContents *)arrayBuffer_1);
      if ((bool)((byte)iVar3 & 1) != bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCADeserialization.cpp"
                                    ,0xe0,
                                    "(arrayBuffer->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly())"
                                    ,
                                    "arrayBuffer->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly()"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 0;
      }
      *(SharedArrayBuffer **)deepClone_local = pSVar16;
    }
    bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar2) {
      pRVar18 = Js::JavascriptProxy::AutoProxyWrapper(*(Var *)deepClone_local);
      *(RecyclableObject **)deepClone_local = pRVar18;
    }
    return true;
  }
  pvVar5 = StreamReader::ReadHostObject(this->m_reader);
  *(Var *)deepClone_local = pvVar5;
  *(undefined4 *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = 4;
  return true;
}

Assistant:

bool DeserializationCloner<Reader>::TryCloneObject(SrcTypeId typeId, Src src, Dst* dst, SCADeepCloneType* deepClone)
    {
        ScriptContext* scriptContext = this->GetScriptContext();
        JavascriptLibrary* lib = scriptContext->GetLibrary();
        *deepClone = SCADeepCloneType::None;
        bool isObject = true;

        if (typeId == SCA_Transferable)
        {
            scaposition_t pos;
            m_reader->Read(&pos);

            *dst = this->GetEngine()->ClaimTransferable(pos, lib);
            if (*dst == nullptr)
            {
                this->ThrowSCADataCorrupt();
            }

            return true;
        }

        if (IsSCAHostObject(typeId))
        {
            *dst = m_reader->ReadHostObject();
            *deepClone = SCADeepCloneType::HostObject;
            return true;
        }

        switch (typeId)
        {
        case SCA_StringValue: // Clone string value as object type to resolve multiple references
            {               
                charcount_t len;
                const char16* buf = ReadString(&len);
                *dst = Js::JavascriptString::NewWithBuffer(buf, len, scriptContext);
                isObject = false;
            }
            break;

        case SCA_BooleanTrueObject:
            *dst = lib->CreateBooleanObject(TRUE);
            break;

        case SCA_BooleanFalseObject:
            *dst = lib->CreateBooleanObject(FALSE);
            break;

        case SCA_DateObject:
            {
                double dbl;
                m_reader->Read(&dbl);
                *dst = lib->CreateDate(dbl);
            }
            break;

        case SCA_NumberObject:
            {
                double dbl;
                m_reader->Read(&dbl);
                *dst = lib->CreateNumberObjectWithCheck(dbl);
            }
            break;

        case SCA_StringObject:
            {
                charcount_t len;
                const char16* buf = ReadString(&len);
                *dst = lib->CreateStringObject(buf, len);
            }
            break;

        case SCA_RegExpObject:
            {
                charcount_t len;
                const char16* buf = ReadString(&len);

                DWORD flags;
                m_reader->Read(&flags);
                *dst = JavascriptRegExp::CreateRegEx(buf, len,
                    static_cast<UnifiedRegex::RegexFlags>(flags), scriptContext);
            }
            break;

        case SCA_Object:
            {
                *dst = lib->CreateObject();
                *deepClone = SCADeepCloneType::Object;
            }
            break;

        case SCA_Map:
            {
                *dst = JavascriptMap::New(scriptContext);
                *deepClone = SCADeepCloneType::Map;
            }
            break;

        case SCA_Set:
            {
                *dst = JavascriptSet::New(scriptContext);
                *deepClone = SCADeepCloneType::Set;
            }
            break;

        case SCA_DenseArray:
        case SCA_SparseArray:
            {
                uint32 length;
                Read(&length);
                *dst = lib->CreateArray(length);
                *deepClone = SCADeepCloneType::Object;
            }
            break;

        case SCA_ArrayBuffer:
            {
                uint32 len;
                m_reader->Read(&len);
                ArrayBuffer* arrayBuffer = lib->CreateArrayBuffer(len);
                Read(arrayBuffer->GetBuffer(), arrayBuffer->GetByteLength());
                *dst = arrayBuffer;
            }
            break;

        case SCA_SharedArrayBuffer:
            {
                SharedContents * sharedContents;
                m_reader->Read((intptr_t*)&sharedContents);

                SharedArrayBuffer* arrayBuffer = lib->CreateSharedArrayBuffer(sharedContents);
                Assert(arrayBuffer->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly());
                *dst = arrayBuffer;
            }
            break;

//#ifdef ENABLE_WASM
//        case SCA_WebAssemblyModule:
//        {
//            uint32 len;
//            m_reader->Read(&len);
//            byte* buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), byte, len);
//            Read(buffer, len);
//            WebAssemblySource wasmSrc(buffer, len, true, scriptContext);
//            *dst = WebAssemblyModule::CreateModule(scriptContext, &wasmSrc);
//            break;
//        }
//        case SCA_WebAssemblyMemory:
//        {
//            uint32 initialLength = 0;
//            uint32 maximumLength = 0;
//            uint32 isShared = 0;
//            m_reader->Read(&initialLength);
//            m_reader->Read(&maximumLength);
//
//#ifdef ENABLE_WASM_THREADS
//            m_reader->Read(&isShared);
//            if (isShared)
//            {
//                SharedContents * sharedContents;
//                m_reader->Read((intptr_t*)&sharedContents);
//                *dst = WebAssemblyMemory::CreateFromSharedContents(initialLength, maximumLength, sharedContents, scriptContext);
//            }
//            else
//#endif
//            {
//                uint32 len;
//                m_reader->Read(&len);
//                WebAssemblyMemory* mem = WebAssemblyMemory::CreateForExistingBuffer(initialLength, maximumLength, len, scriptContext);
//                Read(mem->GetBuffer()->GetBuffer(), len);
//                *dst = mem;
//            }
//            break;
//        }
//#endif

        case SCA_Uint8ClampedArray:
            // If Khronos Interop is not enabled, we don't have Uint8ClampedArray available.
            // This is a scenario where the source buffer was created in a newer document mode 
            // but needs to be deserialized in an older document mode. 
            // What we want to do is return the buffer as a CanvasPixelArray instead of 
            // Uint8ClampedArray since the older document mode knows what CanvasPixelArray is but
            // not what Uint8ClampedArray is.
            // We don't support pixelarray in edge anymore.
            // Intentionally fall through to default (TypedArray) label

        default:
            if (IsSCATypedArray(typeId) || typeId == SCA_DataView)
            {
                ReadTypedArray(typeId, dst);
                break;
            }
            return false; // Not a supported object type
        }

#ifdef ENABLE_JS_ETW
        if (EventEnabledJSCRIPT_RECYCLER_ALLOCATE_OBJECT() && isObject)
        {
            EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(*dst);
        }
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            *dst = JavascriptProxy::AutoProxyWrapper(*dst);
        }
#endif
        return true;
    }